

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceTexture::RunIteration
          (BasicResourceTexture *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  GLint location;
  int depth;
  ostream *poVar3;
  undefined7 in_register_00000009;
  bool *compile_error;
  GLuint index;
  ulong uVar4;
  int i;
  uint uVar5;
  int height;
  ulong __n;
  long lVar6;
  int width;
  bool bVar7;
  uvec3 global_size;
  GLuint fbo;
  GLuint *local_228;
  GLuint *local_220;
  uvec3 *local_218;
  undefined4 local_20c;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texture_data;
  Vector<float,_4> local_1e0;
  Vector<float,_4> local_1d0;
  long local_1c0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> buffer_data;
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  tcu::operator*((tcu *)&global_size,param_1,num_groups);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer_data);
  poVar3 = std::operator<<((ostream *)
                           &buffer_data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "\nlayout(local_size_x = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", local_size_y = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", local_size_z = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,") in;\nconst uvec3 kGlobalSize = uvec3(");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,
                           ");\nuniform sampler1D g_sampler0;\nuniform sampler2D g_sampler1;\nuniform sampler3D g_sampler2;\nuniform sampler2DRect g_sampler3;\nuniform sampler1DArray g_sampler4;\nuniform sampler2DArray g_sampler5;\nuniform samplerBuffer g_sampler6;\nuniform sampler2DMS g_sampler7;\nuniform sampler2DMSArray g_sampler8;\nlayout(std430) buffer OutputBuffer {\n  vec4 data0["
                          );
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"];\n  vec4 data1[");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"];\n  vec4 data2[");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"];\n  vec4 data3[");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"];\n  vec4 data4[");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"];\n  vec4 data5[");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"];\n  vec4 data6[");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"];\n  vec4 data7[");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"];\n  vec4 data8[");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,
                  "];\n} g_out_buffer;\nvoid main() {\n  const uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * kGlobalSize.x +\n                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.data0[global_index] = texelFetch(g_sampler0, int(gl_GlobalInvocationID), 0);\n  g_out_buffer.data1[global_index] = texture(g_sampler1, vec2(gl_GlobalInvocationID) / vec2(kGlobalSize));\n  g_out_buffer.data2[global_index] = textureProj(g_sampler2, vec4(vec3(gl_GlobalInvocationID) / vec3(kGlobalSize), 1.0));\n  g_out_buffer.data3[global_index] = textureProjOffset(g_sampler3, vec3(vec2(gl_GlobalInvocationID), 1.0), ivec2(0));\n  g_out_buffer.data4[global_index] = textureLodOffset(g_sampler4, vec2(gl_GlobalInvocationID.x / kGlobalSize.x, gl_GlobalInvocationID.y), 0.0, 0);\n  g_out_buffer.data5[global_index] = texelFetchOffset(g_sampler5, ivec3(gl_GlobalInvocationID), 0, ivec2(0));\n  g_out_buffer.data6[global_index] = texelFetch(g_sampler6, int(global_index));\n  g_out_buffer.data7[global_index] = texelFetch(g_sampler7, ivec2(gl_GlobalInvocationID), 1);\n  g_out_buffer.data8[global_index] = texelFetch(g_sampler8, ivec3(gl_GlobalInvocationID), 2);\n}"
                 );
  std::__cxx11::stringbuf::str();
  local_20c = (undefined4)CONCAT71(in_register_00000009,dispatch_indirect);
  local_218 = num_groups;
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer_data);
  GVar2 = ComputeShaderBase::CreateComputeProgram
                    (&this->super_ComputeShaderBase,(string *)&texture_data);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&texture_data);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  bVar7 = false;
  if (bVar1) {
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    for (uVar5 = 0; uVar5 != 9; uVar5 = uVar5 + 1) {
      sprintf((char *)&buffer_data,"g_sampler%d",(ulong)uVar5);
      location = glu::CallLogWrapper::glGetUniformLocation
                           (this_00,this->m_program,(GLchar *)&buffer_data);
      glu::CallLogWrapper::glUniform1i(this_00,location,uVar5);
    }
    glu::CallLogWrapper::glUseProgram(this_00,0);
    width = local_218->m_data[0] * param_1->m_data[0];
    height = local_218->m_data[1] * param_1->m_data[1];
    depth = local_218->m_data[2] * param_1->m_data[2];
    uVar5 = height * width * depth;
    __n = (ulong)(uVar5 * 9);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&buffer_data,__n,(allocator_type *)&texture_data);
    local_228 = &this->m_storage_buffer;
    GVar2 = this->m_storage_buffer;
    if (GVar2 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,local_228);
      GVar2 = *local_228;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar2);
    uVar4 = (ulong)uVar5;
    local_1c0 = uVar4 * 0x90;
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,local_1c0,
               buffer_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&global_size,123.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&texture_data,uVar4,(Vector<float,_4> *)&global_size,(allocator_type *)&fbo);
    if (this->m_texture[0] == 0) {
      glu::CallLogWrapper::glGenTextures(this_00,9,this->m_texture);
    }
    local_220 = &this->m_texture_buffer;
    if (this->m_texture_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,local_220);
    }
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde0,this->m_texture[0]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage1D
              (this_00,0xde0,0,0x8814,width,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8814,width,height,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c2);
    glu::CallLogWrapper::glBindTexture(this_00,0x806f,this->m_texture[2]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x806f,0,0x8814,width,height,depth,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c3);
    glu::CallLogWrapper::glBindTexture(this_00,0x84f5,this->m_texture[3]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0x84f5,0,0x8814,width,height,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c4);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c18,this->m_texture[4]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0x8c18,0,0x8814,width,height,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c5);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,this->m_texture[5]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x8c1a,0,0x8814,width,height,depth,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c6);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,*local_220);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8c2a,uVar4 << 4,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[6]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,*local_220);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c7);
    glu::CallLogWrapper::glBindTexture(this_00,0x9100,this->m_texture[7]);
    glu::CallLogWrapper::glTexImage2DMultisample(this_00,0x9100,4,0x8814,width,height,'\0');
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c8);
    glu::CallLogWrapper::glBindTexture(this_00,0x9102,this->m_texture[8]);
    glu::CallLogWrapper::glTexImage3DMultisample(this_00,0x9102,4,0x8814,width,height,depth,'\0');
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&fbo);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
    glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->m_texture[7],0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&global_size,123.0);
    glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,(GLfloat *)&global_size);
    glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->m_texture[8],0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&global_size,123.0);
    glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,(GLfloat *)&global_size);
    glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&fbo);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if ((char)local_20c == '\0') {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,local_218->m_data[0],local_218->m_data[1],local_218->m_data[2]);
    }
    else {
      GVar2 = this->m_dispatch_buffer;
      if (GVar2 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar2 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar2);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,local_218,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*local_228);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glGetBufferSubData
              (this_00,0x90d2,0,local_1c0,
               buffer_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    lVar6 = 0;
    for (uVar4 = 0; __n != uVar4; uVar4 = uVar4 + 1) {
      tcu::Vector<float,_4>::Vector
                (&local_1d0,
                 (Vector<float,_4> *)
                 ((long)(buffer_data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar6));
      tcu::Vector<float,_4>::Vector(&local_1e0,123.0);
      if ((local_1d0.m_data[0] != local_1e0.m_data[0]) ||
         (NAN(local_1d0.m_data[0]) || NAN(local_1e0.m_data[0]))) {
LAB_009cb435:
        bVar7 = __n <= uVar4;
        anon_unknown_0::Output("Incorrect data at index %d.\n",uVar4 & 0xffffffff);
        goto LAB_009cb456;
      }
      if ((local_1d0.m_data[1] != local_1e0.m_data[1]) ||
         (NAN(local_1d0.m_data[1]) || NAN(local_1e0.m_data[1]))) goto LAB_009cb435;
      if ((local_1d0.m_data[2] != local_1e0.m_data[2]) ||
         (NAN(local_1d0.m_data[2]) || NAN(local_1e0.m_data[2]))) goto LAB_009cb435;
      if ((local_1d0.m_data[3] != local_1e0.m_data[3]) ||
         (NAN(local_1d0.m_data[3]) || NAN(local_1e0.m_data[3]))) goto LAB_009cb435;
      lVar6 = lVar6 + 0x10;
    }
    bVar7 = true;
LAB_009cb456:
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&texture_data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&buffer_data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  }
  return bVar7;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		glUseProgram(m_program);
		for (int i = 0; i < 9; ++i)
		{
			char name[32];
			sprintf(name, "g_sampler%d", i);
			glUniform1i(glGetUniformLocation(m_program, name), i);
		}
		glUseProgram(0);

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();
		const GLint kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());

		std::vector<vec4> buffer_data(kBufferSize * 9);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize * 9, &buffer_data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		std::vector<vec4> texture_data(kBufferSize, vec4(123.0f));
		if (m_texture[0] == 0)
			glGenTextures(9, m_texture);
		if (m_texture_buffer == 0)
			glGenBuffers(1, &m_texture_buffer);

		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_1D, m_texture[0]);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage1D(GL_TEXTURE_1D, 0, GL_RGBA32F, kWidth, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE2);
		glBindTexture(GL_TEXTURE_3D, m_texture[2]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA32F, kWidth, kHeight, kDepth, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE3);
		glBindTexture(GL_TEXTURE_RECTANGLE, m_texture[3]);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_RECTANGLE, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE4);
		glBindTexture(GL_TEXTURE_1D_ARRAY, m_texture[4]);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_1D_ARRAY, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE5);
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture[5]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA32F, kWidth, kHeight, kDepth, 0, GL_RGBA, GL_FLOAT,
					 &texture_data[0]);

		glActiveTexture(GL_TEXTURE6);
		glBindBuffer(GL_TEXTURE_BUFFER, m_texture_buffer);
		glBufferData(GL_TEXTURE_BUFFER, kBufferSize * sizeof(vec4), &texture_data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);
		glBindTexture(GL_TEXTURE_BUFFER, m_texture[6]);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_texture_buffer);

		glActiveTexture(GL_TEXTURE7);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, m_texture[7]);
		glTexImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, GL_RGBA32F, kWidth, kHeight, GL_FALSE);

		glActiveTexture(GL_TEXTURE8);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, m_texture[8]);
		glTexImage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 4, GL_RGBA32F, kWidth, kHeight, kDepth, GL_FALSE);

		// clear MS textures
		GLuint fbo;
		glGenFramebuffers(1, &fbo);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_texture[7], 0);
		glClearBufferfv(GL_COLOR, 0, &vec4(123.0f)[0]);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_texture[8], 0);
		glClearBufferfv(GL_COLOR, 0, &vec4(123.0f)[0]);
		glDeleteFramebuffers(1, &fbo);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize * 9, &buffer_data[0]);
		for (GLuint index = 0; index < kBufferSize * 9; ++index)
		{
			if (!IsEqual(buffer_data[index], vec4(123.0f)))
			{
				Output("Incorrect data at index %d.\n", index);
				return false;
			}
		}
		return true;
	}